

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

int anon_unknown.dwarf_4a590::HandleCppCheck
              (string *runCmd,string *sourceFile,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *orig_cmd)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  int iVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  pointer __x;
  string_view arg;
  int ret;
  string stdErr;
  string stdOut;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cppcheck_cmd;
  int local_84;
  string local_80;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  arg._M_str = (runCmd->_M_dataplus)._M_p;
  arg._M_len = runCmd->_M_string_length;
  cmExpandedList_abi_cxx11_(&local_40,arg,true);
  __x = (orig_cmd->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (orig_cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pbVar1) {
    do {
      if ((((2 < __x->_M_string_length) && (pcVar7 = (__x->_M_dataplus)._M_p, *pcVar7 == '-')) &&
          (uVar3 = (byte)pcVar7[1] - 0x44, uVar3 < 0x12)) && ((0x20021U >> (uVar3 & 0x1f) & 1) != 0)
         ) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_40,__x);
      }
      __x = __x + 1;
    } while (__x != pbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_40,sourceFile);
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar2 = cmSystemTools::RunSingleCommand
                    (&local_40,&local_60,&local_80,&local_84,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0
                     ,Auto);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error running \'",0xf)
    ;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        ((local_40.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_40.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\': ",3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_60._M_dataplus._M_p,local_60._M_string_length);
    iVar6 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    goto LAB_0016649a;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length);
  lVar4 = std::__cxx11::string::find((char *)&local_80,0x6a824c,0);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)&local_80,0x6a8254,0);
    if (lVar4 != -1) goto LAB_001663db;
    lVar4 = std::__cxx11::string::find((char *)&local_80,0x6a825e,0);
    if (lVar4 != -1) goto LAB_001663db;
    lVar4 = std::__cxx11::string::find((char *)&local_80,0x6a8266,0);
    if (lVar4 != -1) goto LAB_001663db;
    lVar4 = std::__cxx11::string::find((char *)&local_80,0x6a8274,0);
    if (lVar4 != -1) goto LAB_001663db;
    lVar4 = std::__cxx11::string::find((char *)&local_80,0x6a8282,0);
    if (lVar4 != -1) goto LAB_001663db;
  }
  else {
LAB_001663db:
    pcVar7 = "Error: cppcheck reported failure:\n";
    if (local_84 == 0) {
      pcVar7 = "Warning: cppcheck reported diagnostics:\n";
    }
    lVar4 = 0x22;
    if (local_84 == 0) {
      lVar4 = 0x28;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_80._M_dataplus._M_p,local_80._M_string_length);
  iVar6 = local_84;
LAB_0016649a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return iVar6;
}

Assistant:

int HandleCppCheck(const std::string& runCmd, const std::string& sourceFile,
                   const std::vector<std::string>& orig_cmd)
{
  // Construct the cpplint command line.
  std::vector<std::string> cppcheck_cmd = cmExpandedList(runCmd, true);
  // extract all the -D, -U, and -I options from the compile line
  for (auto const& opt : orig_cmd) {
    if (opt.size() > 2) {
      if ((opt[0] == '-') &&
          ((opt[1] == 'D') || (opt[1] == 'I') || (opt[1] == 'U'))) {
        cppcheck_cmd.push_back(opt);
// convert cl / options to - options if needed
#if defined(_WIN32)
      } else if ((opt[0] == '/') &&
                 ((opt[1] == 'D') || (opt[1] == 'I') || (opt[1] == 'U'))) {
        std::string optcopy = opt;
        optcopy[0] = '-';
        cppcheck_cmd.push_back(optcopy);
#endif
      }
    }
  }
  // add the source file
  cppcheck_cmd.push_back(sourceFile);

  // Run the cpplint command line.  Capture its output.
  std::string stdOut;
  std::string stdErr;
  int ret;
  if (!cmSystemTools::RunSingleCommand(cppcheck_cmd, &stdOut, &stdErr, &ret,
                                       nullptr, cmSystemTools::OUTPUT_NONE)) {
    std::cerr << "Error running '" << cppcheck_cmd[0] << "': " << stdOut
              << "\n";
    return 1;
  }
  std::cerr << stdOut;
  // Output the output from cpplint to stderr
  if (stdErr.find("(error)") != std::string::npos ||
      stdErr.find("(warning)") != std::string::npos ||
      stdErr.find("(style)") != std::string::npos ||
      stdErr.find("(performance)") != std::string::npos ||
      stdErr.find("(portability)") != std::string::npos ||
      stdErr.find("(information)") != std::string::npos) {
    if (ret == 0) {
      std::cerr << "Warning: cppcheck reported diagnostics:\n";
    } else {
      std::cerr << "Error: cppcheck reported failure:\n";
    }
  }
  std::cerr << stdErr;

  return ret;
}